

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O2

duckdb_state duckdb_append_varchar_length(duckdb_appender appender,char *val,idx_t length)

{
  duckdb_state dVar1;
  uint uVar2;
  string_t value;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 local_14;
  
  uVar2 = (uint)length;
  if (uVar2 < 0xd) {
    local_14 = 0;
    uStack_1c = 0;
    uStack_18 = 0;
    if (uVar2 == 0) {
      val = (char *)0x0;
    }
    else {
      switchD_016b0717::default(&uStack_1c,val,(ulong)(uVar2 & 0xf));
      val = (char *)CONCAT44(local_14,uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)val;
  }
  value.value._4_1_ = (undefined1)uStack_1c;
  value.value._5_1_ = uStack_1c._1_1_;
  value.value._6_1_ = uStack_1c._2_1_;
  value.value._7_1_ = uStack_1c._3_1_;
  value.value.pointer.length = uVar2;
  value.value.pointer.ptr = val;
  dVar1 = duckdb_append_internal<duckdb::string_t>(appender,value);
  return dVar1;
}

Assistant:

duckdb_state duckdb_append_varchar_length(duckdb_appender appender, const char *val, idx_t length) {
	return duckdb_append_internal<string_t>(appender, string_t(val, duckdb::UnsafeNumericCast<uint32_t>(length)));
}